

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexBoxFilter::buildKernel
          (PtexBoxFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,Res faceRes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 in_XMM2_Db;
  undefined1 auVar8 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  anon_union_4_2_f9ecf184 anon_var_0;
  float fVar12;
  float __x;
  undefined1 auVar14 [16];
  float fVar15;
  float __x_00;
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  
  auVar11._4_12_ = in_register_000012c4;
  auVar11._0_4_ = vw;
  auVar10._0_8_ = auVar11._0_8_;
  auVar10._8_4_ = in_register_000012c4._0_4_;
  auVar10._12_4_ = in_XMM2_Db;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = uw;
  auVar9._0_4_ = vw;
  auVar11 = minps(auVar9,_DAT_0284c920);
  auVar8._0_4_ = (float)(0x3f800000 - ((int)((uint)(byte)faceRes.vlog2 << 0x18) >> 1));
  auVar8._4_4_ = (float)(0x3f800000 - ((int)((uint)(ushort)faceRes << 0x18) >> 1));
  auVar8._8_8_ = 0;
  fVar15 = auVar11._4_4_;
  iVar2 = -(uint)(auVar8._0_4_ < auVar11._0_4_);
  iVar3 = -(uint)(auVar8._4_4_ < fVar15);
  auVar14._4_4_ = iVar3;
  auVar14._0_4_ = iVar2;
  auVar14._8_4_ = iVar3;
  auVar14._12_4_ = iVar3;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._4_4_ = iVar2;
  auVar13._0_4_ = iVar2;
  uVar1 = movmskpd((uint)(byte)faceRes.vlog2,auVar13);
  if ((uVar1 & 2) == 0) {
    fVar15 = auVar8._4_4_;
  }
  if ((uVar1 & 1) == 0) {
    auVar11 = auVar8;
  }
  uVar1 = 0x7f - ((uint)fVar15 >> 0x17);
  iVar2 = ((uVar1 & 0xff) - ((uint)auVar11._0_4_ >> 0xf & 0x1ff00)) + 0x7f00;
  k->res = SUB42(iVar2,0);
  fVar7 = (float)(1 << ((byte)uVar1 & 0x1f));
  fVar12 = (float)(1 << ((byte)((uint)iVar2 >> 8) & 0x1f));
  fVar4 = u * fVar7;
  fVar6 = v * fVar12;
  fVar15 = fVar15 * fVar7;
  fVar12 = auVar11._0_4_ * fVar12;
  __x_00 = fVar15 * -0.5 + fVar4;
  fVar4 = fVar15 * 0.5 + fVar4;
  __x = fVar12 * -0.5 + fVar6;
  fVar6 = fVar12 * 0.5 + fVar6;
  fVar15 = floorf(__x_00);
  fVar7 = ceilf(fVar4);
  fVar12 = floorf(__x);
  fVar5 = ceilf(fVar6);
  k->u = (int)fVar15;
  k->v = (int)fVar12;
  iVar2 = (int)fVar7 - (int)fVar15;
  k->uw = iVar2;
  k->vw = (int)fVar5 - (int)fVar12;
  computeWeights(this,k->ku,iVar2,(fVar15 - __x_00) + 1.0,(fVar4 - fVar7) + 1.0);
  computeWeights(this,k->kv,k->vw,(fVar12 - __x) + 1.0,(fVar6 - fVar5) + 1.0);
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        // compute desired texture res based on filter width
        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        u = u * (float)k.res.u();
        v = v * (float)k.res.v();
        uw *= (float)k.res.u();
        vw *= (float)k.res.v();

        // find integer pixel extent: [u,v] +/- [uw/2,vw/2]
        // (box is 1 unit wide for a 1 unit filter period)
        float u1 = u - 0.5f*uw, u2 = u + 0.5f*uw;
        float v1 = v - 0.5f*vw, v2 = v + 0.5f*vw;
        float u1floor = PtexUtils::floor(u1), u2ceil = PtexUtils::ceil(u2);
        float v1floor = PtexUtils::floor(v1), v2ceil = PtexUtils::ceil(v2);
        k.u = int(u1floor);
        k.v = int(v1floor);
        k.uw = int(u2ceil)-k.u;
        k.vw = int(v2ceil)-k.v;

        // compute kernel weights along u and v directions
        computeWeights(k.ku, k.uw, 1.0f-(u1-u1floor), 1.0f-(u2ceil-u2));
        computeWeights(k.kv, k.vw, 1.0f-(v1-v1floor), 1.0f-(v2ceil-v2));
    }